

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voccomp.c
# Opt level: O0

void vociren(voccxdef *ctx,objnum oldnum,objnum newnum)

{
  long lVar1;
  ushort in_DX;
  ushort in_SI;
  long in_RDI;
  vocwdef *vw;
  vocdef **vp;
  vocdef *v;
  int i;
  undefined8 in_stack_ffffffffffffffa8;
  voccxdef *in_stack_ffffffffffffffb0;
  uint *local_48;
  uint *local_30;
  uint *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  int local_10;
  
  vocialo(in_stack_ffffffffffffffb0,(objnum)((ulong)in_stack_ffffffffffffffa8 >> 0x30));
  *(undefined8 *)
   (*(long *)(in_RDI + 0x58 + (long)((int)(uint)in_DX >> 8) * 8) + (long)(int)(in_DX & 0xff) * 8) =
       *(undefined8 *)
        (*(long *)(in_RDI + 0x58 + (long)((int)(uint)in_SI >> 8) * 8) +
        (long)(int)(in_SI & 0xff) * 8);
  *(undefined8 *)
   (*(long *)(in_RDI + 0x58 + (long)((int)(uint)in_SI >> 8) * 8) + (long)(int)(in_SI & 0xff) * 8) =
       0;
  lVar1 = *(long *)(*(long *)(in_RDI + 0x58 + (long)((int)(uint)in_DX >> 8) * 8) +
                   (long)(int)(in_DX & 0xff) * 8);
  *(byte *)(lVar1 + 8) = *(byte *)(lVar1 + 8) | 1;
  local_20 = (undefined8 *)(in_RDI + 0x670);
  for (local_10 = 0x100; local_10 != 0; local_10 = local_10 + -1) {
    for (local_18 = (undefined8 *)*local_20; local_18 != (undefined8 *)0x0;
        local_18 = (undefined8 *)*local_18) {
      if (*(int *)((long)local_18 + 0xc) == -1) {
        local_30 = (uint *)0x0;
      }
      else {
        local_30 = (uint *)(*(long *)(in_RDI + 0xe70 +
                                     ((ulong)*(uint *)((long)local_18 + 0xc) / 2000) * 8) +
                           ((ulong)*(uint *)((long)local_18 + 0xc) % 2000) * 8);
      }
      local_28 = local_30;
      while (local_28 != (uint *)0x0) {
        if ((ushort)local_28[1] == in_SI) {
          *(ushort *)(local_28 + 1) = in_DX;
          *(byte *)((long)local_28 + 7) = *(byte *)((long)local_28 + 7) | 1;
        }
        if (*local_28 == 0xffffffff) {
          local_48 = (uint *)0x0;
        }
        else {
          local_48 = (uint *)(*(long *)(in_RDI + 0xe70 + ((ulong)*local_28 / 2000) * 8) +
                             ((ulong)*local_28 % 2000) * 8);
        }
        local_28 = local_48;
      }
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void vociren(voccxdef *ctx, objnum oldnum, objnum newnum)
{
    int       i;
    vocdef   *v;
    vocdef  **vp;
    vocwdef  *vw;


    /* make sure we have a page table entry for the original object */
    vocialo(ctx, newnum);

    /* move the old object's inheritance record to the new slot */
    vocinh(ctx, newnum) = vocinh(ctx, oldnum);
    vocinh(ctx, oldnum) = 0;

    /* make the old object an honorary class object */
    vocinh(ctx, newnum)->vociflg |= VOCIFCLASS;

    /* 
     *   Renumber any vocabulary associated with the old object to the new
     *   object.
     */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i != 0 ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (v = *vp ; v != 0 ; v = v->vocnxt)
        {
            /* go through all vocwdef's defined for this word */
            for (vw = vocwget(ctx, v->vocwlst) ; vw ;
                 vw = vocwget(ctx, vw->vocwnxt))
            {
                /* 
                 *   renumber this word and mark it as being associated
                 *   with a class if it's associated with the original
                 *   object 
                 */
                if (vw->vocwobj == oldnum)
                {
                    vw->vocwobj = newnum;
                    vw->vocwflg |= VOCFCLASS;
                }
            }
        }
    }
}